

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

char * lws_json_purify(char *escaped,char *string,int len,int *in_used)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  char *p;
  char *q;
  
  iVar4 = (int)string;
  pcVar2 = escaped;
  if (string == (char *)0x0) {
    *escaped = '\0';
    return pcVar2;
  }
  bVar1 = *string;
  do {
    if ((bVar1 == 0) || (len < 7)) {
      *escaped = 0;
      if (in_used != (int *)0x0) {
        *in_used = (int)string - iVar4;
      }
      return pcVar2;
    }
    iVar3 = len + -1;
    if (bVar1 < 0xd) {
      if (bVar1 == 9) {
        ((byte *)escaped)[0] = 0x5c;
        ((byte *)escaped)[1] = 0x74;
      }
      else {
        if (bVar1 != 10) goto LAB_0010e9c7;
        ((byte *)escaped)[0] = 0x5c;
        ((byte *)escaped)[1] = 0x6e;
      }
LAB_0010e9c1:
      escaped = (char *)((byte *)escaped + 2);
    }
    else {
      if (bVar1 == 0xd) {
        ((byte *)escaped)[0] = 0x5c;
        ((byte *)escaped)[1] = 0x72;
        goto LAB_0010e9c1;
      }
      if ((bVar1 == 0x22) || (bVar1 == 0x5c)) {
LAB_0010e9cd:
        ((byte *)escaped)[0] = 0x5c;
        ((byte *)escaped)[1] = 0x75;
        ((byte *)escaped)[2] = 0x30;
        ((byte *)escaped)[3] = 0x30;
        ((byte *)escaped)[4] = "0123456789ABCDEF"[(byte)*string >> 4];
        ((byte *)escaped)[5] = "0123456789ABCDEF"[(byte)*string & 0xf];
        escaped = (char *)((byte *)escaped + 6);
        iVar3 = len + -6;
      }
      else {
LAB_0010e9c7:
        if ((char)bVar1 < ' ') goto LAB_0010e9cd;
        *escaped = bVar1;
        escaped = (char *)((byte *)escaped + 1);
      }
    }
    bVar1 = ((byte *)string)[1];
    string = (char *)((byte *)string + 1);
    len = iVar3;
  } while( true );
}

Assistant:

const char *
lws_json_purify(char *escaped, const char *string, int len, int *in_used)
{
	const char *p = string;
	char *q = escaped;

	if (!p) {
		escaped[0] = '\0';
		return escaped;
	}

	while (*p && len-- > 6) {
		if (*p == '\t') {
			p++;
			*q++ = '\\';
			*q++ = 't';
			continue;
		}

		if (*p == '\n') {
			p++;
			*q++ = '\\';
			*q++ = 'n';
			continue;
		}

		if (*p == '\r') {
			p++;
			*q++ = '\\';
			*q++ = 'r';
			continue;
		}

		if (*p == '\"' || *p == '\\' || *p < 0x20) {
			*q++ = '\\';
			*q++ = 'u';
			*q++ = '0';
			*q++ = '0';
			*q++ = hex[((*p) >> 4) & 15];
			*q++ = hex[(*p) & 15];
			len -= 5;
			p++;
		} else
			*q++ = *p++;
	}
	*q = '\0';

	if (in_used)
		*in_used = lws_ptr_diff(p, string);

	return escaped;
}